

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5AtomicCountersArrayIndexing.cpp
# Opt level: O1

void __thiscall
glcts::GPUShader5AtomicCountersArrayIndexing::initTest(GPUShader5AtomicCountersArrayIndexing *this)

{
  bool bVar1;
  GLuint index;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  TestError *this_00;
  pointer_____offset_0x10___ *ppuVar7;
  GLuint bufferData [4];
  undefined4 local_28 [4];
  long lVar5;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_gpu_shader5_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"GPU shader5 functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
               ,0x56);
    ppuVar7 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    GVar3 = (**(code **)(lVar5 + 0x3c8))();
    this->m_program_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Creating program object failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                    ,0x5b);
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x91b9);
    this->m_compute_shader_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Creating compute shader object failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                    ,0x5e);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_program_id,this->m_compute_shader_id,1,
                       &m_compute_shader_code,(bool *)0x0);
    if (bVar1) {
      lVar6 = 0;
      do {
        local_28[lVar6] = (int)lVar6;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_buffer_id);
      (**(code **)(lVar5 + 0x40))(0x92c0,this->m_buffer_id);
      (**(code **)(lVar5 + 0x150))(0x92c0,0x10,local_28,0x88ea);
      (**(code **)(lVar5 + 0x48))(0x92c0,0,this->m_buffer_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Could not setup buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                      ,0x71);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not create program object!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
               ,0x62);
    ppuVar7 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar7,tcu::Exception::~Exception);
}

Assistant:

void GPUShader5AtomicCountersArrayIndexing::initTest(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check if gpu_shader5 extension is supported */
	if (!m_is_gpu_shader5_supported)
	{
		throw tcu::NotSupportedError(GPU_SHADER5_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create program object from the supplied compute shader code */
	m_program_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Creating program object failed");

	m_compute_shader_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Creating compute shader object failed");

	if (!buildProgram(m_program_id, m_compute_shader_id, 1, &m_compute_shader_code))
	{
		TCU_FAIL("Could not create program object!");
	}

	glw::GLuint bufferData[m_atomic_counters_array_size];
	for (glw::GLuint index = 0; index < m_atomic_counters_array_size; ++index)
	{
		bufferData[index] = index;
	}

	gl.genBuffers(1, &m_buffer_id);
	gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_buffer_id);
	gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, m_atomic_counters_array_size * sizeof(glw::GLuint), bufferData,
				  GL_DYNAMIC_COPY);
	gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_buffer_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not setup buffer object!");
}